

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

string * __thiscall
ADSBExchangeConnection::GetURL_abi_cxx11_(ADSBExchangeConnection *this,positionTy *pos)

{
  double dVar1;
  double dVar2;
  uint *puVar3;
  positionTy *in_RDX;
  string *in_RDI;
  char url [128];
  string *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_a1 [33];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  positionTy *local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_a1._25_8_ = 0;
  uStack_80 = 0;
  local_a1._9_8_ = 0;
  local_a1._17_8_ = 0;
  __a = in_RDI;
  local_18 = in_RDX;
  dVar1 = positionTy::lat(in_RDX);
  dVar2 = positionTy::lon(local_18);
  local_a1._5_4_ = DataRefs::GetFdStdDistance_nm(&dataRefs);
  local_a1._1_4_ = 0xfa;
  puVar3 = (uint *)std::min<int>((int *)(local_a1 + 5),(int *)(local_a1 + 1));
  __s = local_a1 + 9;
  snprintf(__s,0x80,"https://adsbexchange-com1.p.rapidapi.com/v2/lat/%f/lon/%f/dist/%d/",
           SUB84(dVar1,0),dVar2,(ulong)*puVar3);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  return in_RDI;
}

Assistant:

std::string ADSBExchangeConnection::GetURL (const positionTy& pos)
{
    char url[128] = "";
    snprintf(url, sizeof(url), ADSBEX_RAPIDAPI_URL, pos.lat(), pos.lon(),
             std::min(dataRefs.GetFdStdDistance_nm(), 250));    // max 250nm radius allowed
    return std::string(url);
}